

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O0

c_v64 c_v64_unpacklo_u8_s16(c_v64 a)

{
  c_v64 cVar1;
  int endian;
  c_v64 a_local;
  c_v64 t;
  
  a_local.u8[3] = a.u8[3];
  a_local.u8[2] = a.u8[2];
  a_local.u8[1] = a.u8[1];
  a_local.u8[0] = a.u8[0];
  cVar1.u8[1] = 0;
  cVar1.u8[0] = a_local.u8[0];
  cVar1.u8[2] = a_local.u8[1];
  cVar1.u8[3] = 0;
  cVar1.u8[4] = a_local.u8[2];
  cVar1.u8[5] = 0;
  cVar1.u8[6] = a_local.u8[3];
  cVar1.u8[7] = 0;
  return (c_v64)cVar1.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_unpacklo_u8_s16(c_v64 a) {
  c_v64 t;
  int endian = !!CONFIG_BIG_ENDIAN * 4;
  t.s16[3] = (int16_t)a.u8[3 + endian];
  t.s16[2] = (int16_t)a.u8[2 + endian];
  t.s16[1] = (int16_t)a.u8[1 + endian];
  t.s16[0] = (int16_t)a.u8[0 + endian];
  return t;
}